

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void loadExt(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *db;
  int iVar1;
  uchar *zFile;
  uchar *zProc;
  char *zErrMsg;
  
  zFile = sqlite3_value_text(*argv);
  db = (context->s).db;
  zErrMsg = (char *)0x0;
  if (argc == 2) {
    zProc = sqlite3_value_text(argv[1]);
  }
  else {
    zProc = (uchar *)0x0;
  }
  if (zFile != (uchar *)0x0) {
    iVar1 = sqlite3_load_extension(db,(char *)zFile,(char *)zProc,&zErrMsg);
    if (iVar1 != 0) {
      sqlite3_result_error(context,zErrMsg,-1);
      sqlite3_free(zErrMsg);
    }
  }
  return;
}

Assistant:

static void loadExt(sqlite3_context *context, int argc, sqlite3_value **argv){
  const char *zFile = (const char *)sqlite3_value_text(argv[0]);
  const char *zProc;
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zErrMsg = 0;

  if( argc==2 ){
    zProc = (const char *)sqlite3_value_text(argv[1]);
  }else{
    zProc = 0;
  }
  if( zFile && sqlite3_load_extension(db, zFile, zProc, &zErrMsg) ){
    sqlite3_result_error(context, zErrMsg, -1);
    sqlite3_free(zErrMsg);
  }
}